

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

PipelineClassifier * __thiscall
CoreML::Specification::Model::mutable_pipelineclassifier(Model *this)

{
  bool bVar1;
  PipelineClassifier *this_00;
  Model *this_local;
  
  bVar1 = has_pipelineclassifier(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_pipelineclassifier(this);
    this_00 = (PipelineClassifier *)operator_new(0x20);
    PipelineClassifier::PipelineClassifier(this_00);
    (this->Type_).pipelineclassifier_ = this_00;
  }
  return (this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::PipelineClassifier* Model::mutable_pipelineclassifier() {
  if (!has_pipelineclassifier()) {
    clear_Type();
    set_has_pipelineclassifier();
    Type_.pipelineclassifier_ = new ::CoreML::Specification::PipelineClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.pipelineClassifier)
  return Type_.pipelineclassifier_;
}